

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  uint16 uVar1;
  dxt_format dVar2;
  tile_details *ptVar3;
  void *p_00;
  float *pfVar4;
  color_cluster *pcVar5;
  alpha_cluster *paVar6;
  uint *puVar7;
  unsigned_long_long *puVar8;
  endpoint_indices_details *peVar9;
  vector<unsigned_int> *this_00;
  vector<unsigned_int> *this_01;
  uint8 uVar10;
  crn_thread_id_t cVar11;
  long lVar12;
  executable_task *pObj;
  float (*pafVar13) [8];
  code *pcVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint b;
  elemental_vector *peVar20;
  task_pool *this_02;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  float fVar39;
  uint32 endpoint_1;
  vector<unsigned_short> alpha_selectors_remap;
  vector<unsigned_short> color_selectors_remap;
  vector<unsigned_short> alpha_endpoints_remap;
  uint32 endpoint;
  insert_result insert_result;
  vector<unsigned_short> color_endpoints_remap;
  insert_result insert_result_3;
  undefined1 local_178 [16];
  uint local_168;
  undefined8 local_160;
  elemental_vector local_158;
  elemental_vector local_148;
  elemental_vector local_138;
  vector<unsigned_int> *local_128;
  uint *local_120;
  undefined1 local_118 [16];
  uint local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  uint local_e8;
  undefined8 local_e0;
  vector<unsigned_int> *local_d0;
  uint64 local_c8;
  vector<crnlib::dxt_hc::selector_indices_details> *local_c0;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  vector<crnlib::dxt_hc::endpoint_indices_details> *local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  elemental_vector local_98;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  local_88;
  insert_result local_68;
  anon_struct_16_4_e4b8e16b *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  clear(this);
  dVar2 = p->m_format;
  uVar28 = dVar2 + ~cDXN_YX;
  this->m_has_etc_color_blocks = uVar28 < 5;
  this->m_has_subblocks = uVar28 < 3;
  bVar24 = true;
  if ((dVar2 != cDXT1) && (dVar2 != cDXT5)) {
    bVar24 = uVar28 < 5;
  }
  this->m_has_color_blocks = bVar24;
  uVar28 = dVar2 + ~cDXT3;
  if ((uVar28 < 9) && ((0x147U >> (uVar28 & 0x1f) & 1) != 0)) {
    this->m_num_alpha_blocks = *(uint *)(&DAT_001b08c0 + (ulong)uVar28 * 4);
  }
  else {
    this->m_num_alpha_blocks = (uint)(dVar2 == cDXN_YX) * 2;
    if ((dVar2 == cDXN_YX | bVar24) != 1) {
      return false;
    }
  }
  local_120 = &this->m_num_alpha_blocks;
  this->m_blocks = blocks;
  cVar11 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar11;
  this->m_pTask_pool = p->m_pTask_pool;
  memcpy(&this->m_params,p,0x158);
  if (p->m_num_levels != 0) {
    pafVar13 = this->m_color_derating;
    uVar23 = 0;
    auVar35 = _DAT_001b06b0;
    do {
      fVar39 = p->m_adaptive_tile_color_psnr_derating;
      if ((uVar23 != 0) && (0.25 < fVar39)) {
        local_a8 = (vector<crnlib::dxt_hc::endpoint_indices_details> *)(ulong)(uint)fVar39;
        uStack_a0 = 0;
        uStack_9c = 0;
        fVar27 = powf(3.0,(float)(uVar23 & 0xffffffff));
        auVar35 = _DAT_001b06b0;
        fVar39 = 0.25;
        if (0.25 <= local_a8._0_4_ / fVar27) {
          fVar39 = local_a8._0_4_ / fVar27;
        }
      }
      lVar12 = 0;
      do {
        auVar29._0_4_ =
             ((float)(*(uint *)((long)&DAT_001b07c0 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11)
             + (float)(*(uint *)((long)&DAT_001b07c0 + lVar12) & 0xffff | 0x4b000000);
        auVar29._4_4_ =
             ((float)(*(uint *)((long)&DAT_001b07c4 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11)
             + (float)(*(uint *)((long)&DAT_001b07c4 + lVar12) & 0xffff | 0x4b000000);
        auVar29._8_4_ =
             ((float)(*(uint *)(&UNK_001b07c8 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(*(uint *)(&UNK_001b07c8 + lVar12) & 0xffff | 0x4b000000);
        auVar29._12_4_ =
             ((float)(*(uint *)(&UNK_001b07cc + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(*(uint *)(&UNK_001b07cc + lVar12) & 0xffff | 0x4b000000);
        auVar29 = divps(auVar29,auVar35);
        pfVar4 = (float *)((long)*pafVar13 + lVar12);
        *pfVar4 = auVar29._0_4_ * fVar39 + 0.0;
        pfVar4[1] = auVar29._4_4_ * fVar39 + 0.0;
        pfVar4[2] = auVar29._8_4_ * fVar39 + 0.0;
        pfVar4[3] = auVar29._12_4_ * fVar39 + 0.0;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x20);
      uVar23 = uVar23 + 1;
      pafVar13 = pafVar13 + 1;
    } while (uVar23 < p->m_num_levels);
  }
  lVar12 = 0;
  do {
    *(float *)((long)this->m_alpha_derating + lVar12) =
         ((float)*(uint *)((long)&DAT_001b07c0 + lVar12) / 3.0) *
         (this->m_params).m_adaptive_tile_alpha_psnr_derating + 0.0;
    auVar35 = _DAT_001b06c0;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x20);
  uVar28 = 0;
  uVar30 = 1;
  uVar31 = 2;
  uVar32 = 3;
  lVar12 = 0x8d;
  do {
    auVar38._0_4_ =
         ((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar28 & 0xffff | 0x4b000000);
    auVar38._4_4_ =
         ((float)(uVar30 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar30 & 0xffff | 0x4b000000);
    auVar38._8_4_ =
         ((float)(uVar31 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar31 & 0xffff | 0x4b000000);
    auVar38._12_4_ =
         ((float)(uVar32 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar32 & 0xffff | 0x4b000000);
    auVar29 = divps(auVar38,auVar35);
    *(undefined1 (*) [16])((long)(this->m_color_derating + -1) + 0xc + lVar12 * 4) = auVar29;
    uVar28 = uVar28 + 4;
    uVar30 = uVar30 + 4;
    uVar31 = uVar31 + 4;
    uVar32 = uVar32 + 4;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x18d);
  uVar30 = (this->m_block_weights).m_size;
  uVar28 = (this->m_params).m_num_blocks;
  this->m_num_blocks = uVar28;
  uVar31 = uVar28;
  local_d0 = color_endpoints;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_block_weights).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_block_weights,uVar28,uVar30 + 1 == uVar28,4,
                   (object_mover)0x0,false);
        uVar30 = (this->m_block_weights).m_size;
      }
      memset((this->m_block_weights).m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 2);
      uVar31 = this->m_num_blocks;
    }
    (this->m_block_weights).m_size = uVar28;
  }
  uVar28 = (this->m_block_encodings).m_size;
  if (uVar28 != uVar31) {
    if (uVar28 <= uVar31) {
      if ((this->m_block_encodings).m_capacity < uVar31) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_block_encodings,uVar31,uVar28 + 1 == uVar31,1,
                   (object_mover)0x0,false);
        uVar28 = (this->m_block_encodings).m_size;
      }
      memset((this->m_block_encodings).m_p + uVar28,0,(ulong)(uVar31 - uVar28));
    }
    (this->m_block_encodings).m_size = uVar31;
  }
  lVar12 = 0x668;
  do {
    peVar20 = (elemental_vector *)((long)(this->m_color_derating + -1) + 0xc + lVar12);
    uVar28 = this->m_num_blocks;
    uVar30 = *(uint *)((long)(this->m_color_derating + -1) + 0x14 + lVar12);
    if (uVar30 != uVar28) {
      if (uVar30 <= uVar28) {
        if (*(uint *)((long)(this->m_color_derating + -1) + 0x18 + lVar12) < uVar28) {
          elemental_vector::increase_capacity
                    (peVar20,uVar28,uVar30 + 1 == uVar28,8,(object_mover)0x0,false);
          uVar30 = peVar20->m_size;
        }
        memset((void *)((ulong)uVar30 * 8 + (long)peVar20->m_p),0,(ulong)(uVar28 - uVar30) << 3);
      }
      peVar20->m_size = uVar28;
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x698);
  uVar28 = this->m_num_blocks;
  uVar30 = (this->m_tile_indices).m_size;
  if (uVar30 != uVar28) {
    uVar31 = uVar28;
    if (uVar30 <= uVar28) {
      if ((this->m_tile_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_tile_indices,uVar28,uVar30 + 1 == uVar28,4,
                   (object_mover)0x0,false);
        uVar30 = (this->m_tile_indices).m_size;
      }
      memset((this->m_tile_indices).m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 2);
      uVar31 = this->m_num_blocks;
    }
    (this->m_tile_indices).m_size = uVar28;
    uVar28 = uVar31;
  }
  local_a8 = &this->m_endpoint_indices;
  uVar30 = (this->m_endpoint_indices).m_size;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_endpoint_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_a8,uVar28,uVar30 + 1 == uVar28,8,
                   vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        uVar30 = (this->m_endpoint_indices).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        memset(local_a8->m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 3);
      }
    }
    (this->m_endpoint_indices).m_size = uVar28;
    uVar28 = this->m_num_blocks;
  }
  local_c0 = &this->m_selector_indices;
  uVar30 = (this->m_selector_indices).m_size;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_selector_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_c0,uVar28,uVar30 + 1 == uVar28,6,
                   vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        uVar30 = (this->m_selector_indices).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        memset(local_c0->m_p + uVar30,0,(((ulong)(uVar28 - uVar30) * 6 - 6) / 6) * 6 + 6);
      }
    }
    (this->m_selector_indices).m_size = uVar28;
    uVar28 = this->m_num_blocks;
  }
  uVar30 = (this->m_tiles).m_size;
  uVar31 = uVar30 - uVar28;
  if (uVar31 != 0) {
    if (uVar30 < uVar28 || uVar31 == 0) {
      if ((this->m_tiles).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,uVar28,uVar30 + 1 == uVar28,0x48,
                   vector<crnlib::dxt_hc::tile_details>::object_mover,false);
        uVar30 = (this->m_tiles).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        ptVar3 = (this->m_tiles).m_p;
        lVar12 = 0;
        do {
          *(undefined1 (*) [16])((long)ptVar3[uVar30].color_endpoint.m_s + lVar12 + -0x14) =
               (undefined1  [16])0x0;
          lVar12 = lVar12 + 0x48;
        } while ((ulong)(uVar28 - uVar30) * 0x48 != lVar12);
      }
    }
    else {
      ptVar3 = (this->m_tiles).m_p;
      lVar12 = 0;
      do {
        p_00 = *(void **)((long)ptVar3[uVar28].color_endpoint.m_s + lVar12 + -0x14);
        if (p_00 != (void *)0x0) {
          crnlib_free(p_00);
        }
        lVar12 = lVar12 + 0x48;
      } while ((ulong)uVar31 * 0x48 != lVar12);
    }
    (this->m_tiles).m_size = uVar28;
  }
  auVar38 = _DAT_001a70c0;
  auVar29 = _DAT_001a7020;
  auVar35 = _DAT_001a7010;
  uVar28 = p->m_num_levels;
  if ((ulong)uVar28 != 0) {
    pfVar4 = (this->m_block_weights).m_p;
    uVar23 = 0;
    do {
      uVar30 = p->m_levels[uVar23].m_first_block;
      uVar15 = (ulong)uVar30;
      uVar31 = p->m_levels[uVar23].m_num_blocks + uVar30;
      if (uVar30 < uVar31) {
        fVar39 = p->m_levels[uVar23].m_weight;
        lVar12 = uVar31 - uVar15;
        lVar18 = lVar12 + -1;
        auVar33._8_4_ = (int)lVar18;
        auVar33._0_8_ = lVar18;
        auVar33._12_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar33 = auVar33 ^ auVar29;
        uVar19 = 0;
        do {
          auVar34._8_4_ = (int)uVar19;
          auVar34._0_8_ = uVar19;
          auVar34._12_4_ = (int)(uVar19 >> 0x20);
          auVar36 = (auVar34 | auVar35) ^ auVar29;
          iVar17 = auVar33._4_4_;
          if ((bool)(~(iVar17 < auVar36._4_4_ ||
                      auVar33._0_4_ < auVar36._0_4_ && auVar36._4_4_ == iVar17) & 1)) {
            pfVar4[uVar15 + uVar19] = fVar39;
          }
          if (auVar36._12_4_ <= auVar33._12_4_ &&
              (auVar36._8_4_ <= auVar33._8_4_ || auVar36._12_4_ != auVar33._12_4_)) {
            pfVar4[uVar15 + uVar19 + 1] = fVar39;
          }
          auVar34 = (auVar34 | auVar38) ^ auVar29;
          iVar37 = auVar34._4_4_;
          if (iVar37 <= iVar17 && (iVar37 != iVar17 || auVar34._0_4_ <= auVar33._0_4_)) {
            pfVar4[uVar15 + uVar19 + 2] = fVar39;
            pfVar4[uVar15 + uVar19 + 3] = fVar39;
          }
          uVar19 = uVar19 + 4;
        } while ((lVar12 + 3U & 0xfffffffffffffffc) != uVar19);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar28);
  }
  this_02 = this->m_pTask_pool;
  uVar23 = 0;
  local_128 = alpha_endpoints;
  do {
    pcVar14 = determine_tiles_task;
    if (this->m_has_subblocks != false) {
      pcVar14 = determine_tiles_task_etc;
    }
    local_c8 = uVar23;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d29c0;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)pcVar14;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(this_02,pObj,local_c8,(void *)0x0);
    uVar28 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar28;
    this_02 = this->m_pTask_pool;
  } while (uVar28 <= this_02->m_num_threads);
  task_pool::join(this_02);
  this_01 = local_d0;
  this_00 = local_128;
  this->m_num_tiles = 0;
  uVar23 = (ulong)(this->m_tiles).m_size;
  if (uVar23 != 0) {
    ptVar3 = (this->m_tiles).m_p;
    lVar12 = 0;
    uVar16 = 0;
    do {
      if (*(int *)((long)(ptVar3->color_endpoint).m_s + lVar12 + -0xc) != 0) {
        uVar16 = uVar16 + 1;
        this->m_num_tiles = uVar16;
      }
      lVar12 = lVar12 + 0x48;
    } while (uVar23 * 0x48 != lVar12);
  }
  if (this->m_has_color_blocks != false) {
    determine_color_endpoints(this);
  }
  if (*local_120 != 0) {
    determine_alpha_endpoints(this);
  }
  if (this->m_has_color_blocks == true) {
    create_color_selector_codebook(this);
  }
  if (*local_120 != 0) {
    create_alpha_selector_codebook(this);
  }
  vector<unsigned_int>::reserve(this_01,(this->m_color_clusters).m_size + this_01->m_size);
  uVar16 = (this->m_color_clusters).m_size;
  local_98.m_p = (void *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  if (uVar16 == 0) {
    local_88.m_values.m_p = (raw_node *)0x0;
    local_88.m_values.m_size = 0;
    local_88.m_values.m_capacity = 0;
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_98,uVar16,uVar16 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_98.m_size * 2 + (long)local_98.m_p),0,
           (ulong)(uVar16 - local_98.m_size) * 2);
    local_98.m_size = uVar16;
    uVar28 = (this->m_color_clusters).m_size;
    local_88.m_values.m_p = (raw_node *)0x0;
    local_88.m_values.m_size = 0;
    local_88.m_values.m_capacity = 0;
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
    if (uVar28 != 0) {
      lVar12 = 0x22;
      uVar23 = 0;
      do {
        pcVar5 = (this->m_color_clusters).m_p;
        if (*(int *)((long)pcVar5->blocks + lVar12 * 2 + -0xc) != 0) {
          uVar16 = *(uint *)((long)pcVar5->blocks + lVar12 * 2 + -4);
          if (this->m_has_etc_color_blocks == false) {
            uVar16 = dxt1_block::pack_endpoints
                               (uVar16,*(uint *)((long)&pcVar5->blocks[0].m_p + lVar12 * 2));
          }
          local_118._0_4_ = uVar16;
          local_178._0_4_ = this_01->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_f8,&local_88,(uint *)local_118,(uint *)local_178);
          if (local_e8._0_1_ == true) {
            uVar28 = this_01->m_size;
            *(short *)((long)local_98.m_p + uVar23 * 2) = (short)uVar28;
            if (this_01->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,uVar28 + 1,true,4,(object_mover)0x0,false);
              uVar28 = this_01->m_size;
            }
            this_01->m_p[uVar28] = local_118._0_4_;
            this_01->m_size = this_01->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_98.m_p + uVar23 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_f8._0_8_)->m_p[(uint)local_f8._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_color_clusters).m_size;
        }
        uVar23 = uVar23 + 1;
        lVar12 = lVar12 + 0x2c;
      } while (uVar23 < uVar28);
    }
  }
  vector<unsigned_int>::reserve(this_00,(this->m_alpha_clusters).m_size + this_00->m_size);
  uVar16 = (this->m_alpha_clusters).m_size;
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar16 == 0) {
    local_f8._0_8_ = (raw_node *)0x0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_e8 = 0x20;
    local_e0._0_4_ = 0;
    local_e0._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_138,uVar16,uVar16 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_138.m_size * 2 + (long)local_138.m_p),0,
           (ulong)(uVar16 - local_138.m_size) * 2);
    local_138.m_size = uVar16;
    uVar28 = (this->m_alpha_clusters).m_size;
    local_f8._0_8_ = (raw_node *)0x0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_e8 = 0x20;
    local_e0._0_4_ = 0;
    local_e0._4_4_ = 0;
    if (uVar28 != 0) {
      lVar12 = 0x22;
      uVar23 = 0;
      do {
        paVar6 = (this->m_alpha_clusters).m_p;
        if (*(int *)((long)paVar6->blocks + lVar12 * 2 + -0xc) != 0) {
          uVar16 = dxt5_block::pack_endpoints
                             (*(uint *)((long)paVar6->blocks + lVar12 * 2 + -4),
                              *(uint *)((long)&paVar6->blocks[0].m_p + lVar12 * 2));
          local_178._0_4_ = uVar16;
          local_68.first.m_pTable._0_4_ = this_00->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_118,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_f8,(uint *)local_178,(uint *)&local_68);
          if (local_108._0_1_ == true) {
            uVar28 = this_00->m_size;
            *(short *)((long)local_138.m_p + uVar23 * 2) = (short)uVar28;
            if (this_00->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,uVar28 + 1,true,4,(object_mover)0x0,false);
              uVar28 = this_00->m_size;
            }
            this_00->m_p[uVar28] = local_178._0_4_;
            this_00->m_size = this_00->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_138.m_p + uVar23 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_118._0_8_)->m_p[(uint)local_118._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_alpha_clusters).m_size;
        }
        uVar23 = uVar23 + 1;
        lVar12 = lVar12 + 0x48;
      } while (uVar23 < uVar28);
    }
  }
  vector<unsigned_int>::reserve
            (color_selectors,(this->m_color_selectors).m_size + color_selectors->m_size);
  uVar16 = (this->m_color_selectors).m_size;
  local_148.m_p = (void *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  if (uVar16 == 0) {
    local_118._0_8_ = (raw_node *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108 = 0x20;
    local_100._0_4_ = 0;
    local_100._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_148,uVar16,uVar16 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_148.m_size * 2 + (long)local_148.m_p),0,
           (ulong)(uVar16 - local_148.m_size) * 2);
    local_148.m_size = uVar16;
    uVar28 = (this->m_color_selectors).m_size;
    local_118._0_8_ = (raw_node *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108 = 0x20;
    local_100._0_4_ = 0;
    local_100._4_4_ = 0;
    if (uVar28 != 0) {
      uVar23 = 0;
      do {
        if ((this->m_color_selectors_used).m_p[uVar23] == true) {
          local_68.first.m_pTable._0_4_ = color_selectors->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_178,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_118,(this->m_color_selectors).m_p + uVar23,(uint *)&local_68);
          if (local_168._0_1_ == true) {
            uVar28 = color_selectors->m_size;
            *(short *)((long)local_148.m_p + uVar23 * 2) = (short)uVar28;
            puVar7 = (this->m_color_selectors).m_p;
            if (color_selectors->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_selectors,uVar28 + 1,true,4,(object_mover)0x0,
                         false);
              uVar28 = color_selectors->m_size;
            }
            color_selectors->m_p[uVar28] = puVar7[uVar23];
            color_selectors->m_size = color_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_148.m_p + uVar23 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_178._0_8_)->m_p[(uint)local_178._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_color_selectors).m_size;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < uVar28);
    }
  }
  vector<unsigned_long_long>::reserve
            (alpha_selectors,(this->m_alpha_selectors).m_size + alpha_selectors->m_size);
  uVar16 = (this->m_alpha_selectors).m_size;
  local_158.m_p = (void *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  if (uVar16 == 0) {
    local_178._0_8_ = (raw_node *)0x0;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_158,uVar16,uVar16 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_158.m_size * 2 + (long)local_158.m_p),0,
           (ulong)(uVar16 - local_158.m_size) * 2);
    local_158.m_size = uVar16;
    uVar28 = (this->m_alpha_selectors).m_size;
    local_178._0_8_ = (raw_node *)0x0;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
    if (uVar28 != 0) {
      uVar23 = 0;
      do {
        if ((this->m_alpha_selectors_used).m_p[uVar23] == true) {
          local_ac = alpha_selectors->m_size;
          hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
          ::insert(&local_68,
                   (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    *)local_178,(this->m_alpha_selectors).m_p + uVar23,&local_ac);
          if (local_68.second == true) {
            uVar28 = alpha_selectors->m_size;
            *(short *)((long)local_158.m_p + uVar23 * 2) = (short)uVar28;
            puVar8 = (this->m_alpha_selectors).m_p;
            if (alpha_selectors->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)alpha_selectors,uVar28 + 1,true,8,(object_mover)0x0,
                         false);
              uVar28 = alpha_selectors->m_size;
            }
            alpha_selectors->m_p[uVar28] = puVar8[uVar23];
            alpha_selectors->m_size = alpha_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_158.m_p + uVar23 * 2) =
                 *(undefined2 *)
                  (*(long *)CONCAT44(local_68.first.m_pTable._4_4_,(uint)local_68.first.m_pTable) +
                   8 + (ulong)local_68.first.m_index * 0x10);
          }
          uVar28 = (this->m_alpha_selectors).m_size;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < uVar28);
    }
  }
  uVar16 = this->m_num_blocks;
  uVar28 = endpoint_indices->m_size;
  if (uVar28 != uVar16) {
    if (uVar28 <= uVar16) {
      if (endpoint_indices->m_capacity < uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)endpoint_indices,uVar16,uVar28 + 1 == uVar16,8,
                   vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        uVar28 = endpoint_indices->m_size;
      }
      if (uVar16 - uVar28 != 0) {
        memset(endpoint_indices->m_p + uVar28,0,(ulong)(uVar16 - uVar28) << 3);
      }
    }
    endpoint_indices->m_size = uVar16;
    uVar16 = this->m_num_blocks;
  }
  uVar28 = selector_indices->m_size;
  if (uVar28 != uVar16) {
    if (uVar28 <= uVar16) {
      if (selector_indices->m_capacity < uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)selector_indices,uVar16,uVar28 + 1 == uVar16,6,
                   vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        uVar28 = selector_indices->m_size;
      }
      if (uVar16 - uVar28 != 0) {
        memset(selector_indices->m_p + uVar28,0,(((ulong)(uVar16 - uVar28) * 6 - 6) / 6) * 6 + 6);
      }
    }
    selector_indices->m_size = uVar16;
  }
  uVar28 = p->m_num_levels;
  if (uVar28 != 0) {
    local_50 = p->m_levels;
    uVar23 = 0;
    do {
      uVar30 = local_50[uVar23].m_first_block;
      local_b8 = p->m_levels[uVar23].m_num_blocks + uVar30;
      if (uVar30 < local_b8) {
        local_b4 = p->m_levels[uVar23].m_block_width;
        local_38 = (ulong)-local_b4;
        local_40 = (ulong)~local_b4;
        iVar17 = 0;
        do {
          if (local_b4 != 0) {
            bVar22 = this->m_has_subblocks;
            uVar31 = uVar30 - 1;
            uVar21 = -local_b4 + uVar30;
            uVar32 = ~local_b4 + uVar30;
            uVar28 = 0;
            local_b0 = iVar17;
            do {
              bVar24 = uVar28 != 0 || iVar17 != 0;
              bVar26 = (bVar22 & 1) != 0 && (uVar28 != 0 && iVar17 != 0);
              local_128 = (vector<unsigned_int> *)(ulong)uVar30;
              uVar15 = (ulong)this->m_has_color_blocks ^ 1;
              local_c8 = CONCAT44(local_c8._4_4_,uVar31);
              local_d0 = (vector<unsigned_int> *)CONCAT44(local_d0._4_4_,uVar21);
              bVar25 = iVar17 != 0;
              if ((uint)uVar15 < this->m_num_alpha_blocks + 1) {
                do {
                  peVar20 = &local_138;
                  if (uVar15 == 0) {
                    peVar20 = &local_98;
                  }
                  uVar1 = *(uint16 *)
                           ((long)peVar20->m_p +
                           (ulong)local_a8->m_p[(long)local_128].field_0.component[uVar15] * 2);
                  peVar9 = endpoint_indices->m_p;
                  if (bVar24) {
                    bVar24 = uVar1 == peVar9[uVar31].field_0.component[uVar15];
                  }
                  else {
                    bVar24 = false;
                  }
                  if (bVar25) {
                    bVar25 = uVar1 == peVar9[uVar21].field_0.component[uVar15];
                  }
                  else {
                    bVar25 = false;
                  }
                  if (bVar26) {
                    bVar26 = uVar1 == peVar9[uVar32].field_0.component[uVar15];
                  }
                  else {
                    bVar26 = false;
                  }
                  peVar9[(long)local_128].field_0.component[uVar15] = uVar1;
                  peVar20 = &local_158;
                  if (uVar15 == 0) {
                    peVar20 = &local_148;
                  }
                  selector_indices->m_p[(long)local_128].field_0.component[uVar15] =
                       *(uint16 *)
                        ((long)peVar20->m_p +
                        (ulong)local_c0->m_p[(long)local_128].field_0.component[uVar15] * 2);
                  uVar15 = uVar15 + 1;
                } while (uVar15 < *local_120 + 1);
                bVar22 = this->m_has_subblocks;
              }
              if (((bVar22 & 1) == 0) || ((uVar30 & 1) == 0)) {
                uVar10 = '\x01';
                if ((!bVar24) && (uVar10 = bVar26 * '\x03', bVar25)) {
                  uVar10 = '\x02';
                }
              }
              else {
                uVar10 = local_a8->m_p[(long)local_128].reference;
              }
              endpoint_indices->m_p[(long)local_128].reference = uVar10;
              uVar28 = uVar28 + 1;
              uVar30 = uVar30 + 1;
              uVar31 = uVar31 + 1;
              uVar21 = uVar21 + 1;
              uVar32 = uVar32 + 1;
            } while (uVar28 != local_b4);
          }
          iVar17 = iVar17 + 1;
        } while (uVar30 < local_b8);
        uVar28 = p->m_num_levels;
        local_48 = uVar23;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar28);
  }
  this->m_pTask_pool = (task_pool *)0x0;
  if (local_178._8_4_ == 0) {
    if ((hash_map_type *)local_178._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_178._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_178._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_178._0_8_);
    }
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
  }
  if (local_158.m_p != (void *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if (local_118._8_4_ == 0) {
    if ((hash_map_type *)local_118._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_118._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_118._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_118._0_8_);
    }
    local_108 = 0x20;
    local_100._0_4_ = 0;
    local_100._4_4_ = 0;
  }
  if (local_148.m_p != (void *)0x0) {
    crnlib_free(local_148.m_p);
  }
  if (local_f8._8_4_ == 0) {
    if ((hash_map_type *)local_f8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_f8._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_f8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_f8._0_8_);
    }
    local_e8 = 0x20;
    local_e0._0_4_ = 0;
    local_e0._4_4_ = 0;
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  if (local_88.m_values.m_size == 0) {
    if (local_88.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_88.m_values.m_p);
    }
  }
  else {
    if (local_88.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_88.m_values.m_p);
    }
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
  }
  if (local_98.m_p != (void *)0x0) {
    crnlib_free(local_98.m_p);
  }
  return true;
}

Assistant:

bool dxt_hc::compress(
        color_quad_u8 (*blocks)[16],
        crnlib::vector<endpoint_indices_details>& endpoint_indices,
        crnlib::vector<selector_indices_details>& selector_indices,
        crnlib::vector<uint32>& color_endpoints,
        crnlib::vector<uint32>& alpha_endpoints,
        crnlib::vector<uint32>& color_selectors,
        crnlib::vector<uint64>& alpha_selectors,
        const params& p)
    {
        clear();
        m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
        m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
        m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
        m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2
                                                                                                                                                                               : 0;
        if (!m_has_color_blocks && !m_num_alpha_blocks)
        {
            return false;
        }
        m_blocks = blocks;
        m_main_thread_id = crn_get_current_thread_id();
        m_pTask_pool = p.m_pTask_pool;
        m_params = p;

        uint tile_derating[8] = { 0, 1, 1, 2, 2, 2, 2, 3 };
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
            if (level && adaptive_tile_color_psnr_derating > .25f)
            {
                adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
            }
            for (uint e = 0; e < 8; e++)
            {
                m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
            }
        }
        for (uint e = 0; e < 8; e++)
        {
            m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
        }
        for (uint i = 0; i < 256; i++)
        {
            m_uint8_to_float[i] = i * 1.0f / 255.0f;
        }

        m_num_blocks = m_params.m_num_blocks;
        m_block_weights.resize(m_num_blocks);
        m_block_encodings.resize(m_num_blocks);
        for (uint c = 0; c < 3; c++)
        {
            m_block_selectors[c].resize(m_num_blocks);
        }
        m_tile_indices.resize(m_num_blocks);
        m_endpoint_indices.resize(m_num_blocks);
        m_selector_indices.resize(m_num_blocks);
        m_tiles.resize(m_num_blocks);

        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float weight = p.m_levels[level].m_weight;
            for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
            {
                m_block_weights[b] = weight;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
        }
        m_pTask_pool->join();

        m_num_tiles = 0;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_num_tiles++;
            }
        }

        if (m_has_color_blocks)
        {
            determine_color_endpoints();
        }

        if (m_num_alpha_blocks)
        {
            determine_alpha_endpoints();
        }

        if (m_has_color_blocks)
        {
            create_color_selector_codebook();
        }

        if (m_num_alpha_blocks)
        {
            create_alpha_selector_codebook();
        }

        color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
        crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
        hash_map<uint32, uint> color_endpoints_map;
        for (uint i = 0; i < m_color_clusters.size(); i++)
        {
            if (m_color_clusters[i].pixels.size())
            {
                uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint : dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
                if (insert_result.second)
                {
                    color_endpoints_remap[i] = color_endpoints.size();
                    color_endpoints.push_back(endpoint);
                }
                else
                {
                    color_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
        crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
        hash_map<uint32, uint> alpha_endpoints_map;
        for (uint i = 0; i < m_alpha_clusters.size(); i++)
        {
            if (m_alpha_clusters[i].pixels.size())
            {
                uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
                if (insert_result.second)
                {
                    alpha_endpoints_remap[i] = alpha_endpoints.size();
                    alpha_endpoints.push_back(endpoint);
                }
                else
                {
                    alpha_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
        crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
        hash_map<uint32, uint> color_selectors_map;
        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            if (m_color_selectors_used[i])
            {
                hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
                if (insert_result.second)
                {
                    color_selectors_remap[i] = color_selectors.size();
                    color_selectors.push_back(m_color_selectors[i]);
                }
                else
                {
                    color_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
        crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
        hash_map<uint64, uint> alpha_selectors_map;
        for (uint i = 0; i < m_alpha_selectors.size(); i++)
        {
            if (m_alpha_selectors_used[i])
            {
                hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
                if (insert_result.second)
                {
                    alpha_selectors_remap[i] = alpha_selectors.size();
                    alpha_selectors.push_back(m_alpha_selectors[i]);
                }
                else
                {
                    alpha_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        endpoint_indices.resize(m_num_blocks);
        selector_indices.resize(m_num_blocks);
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            uint first_block = p.m_levels[level].m_first_block;
            uint end_block = first_block + p.m_levels[level].m_num_blocks;
            uint block_width = p.m_levels[level].m_block_width;
            for (uint by = 0, b = first_block; b < end_block; by++)
            {
                for (uint bx = 0; bx < block_width; bx++, b++)
                {
                    bool top_match = by != 0;
                    bool left_match = top_match || bx;
                    bool diag_match = m_has_subblocks && top_match && bx;
                    for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
                        left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
                        top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
                        diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
                        endpoint_indices[b].component[c] = endpoint_index;
                        uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
                        selector_indices[b].component[c] = selector_index;
                    }
                    endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1
                        : top_match                                                                                         ? 2
                        : diag_match                                                                                        ? 3
                                                                                                                            : 0;
                }
            }
        }

        m_pTask_pool = nullptr;
        return true;
    }